

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

int __thiscall
despot::Parser::ComputeNumOfEntries
          (Parser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *instance,vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *parents,
          NamedVar *child)

{
  int iVar1;
  NamedVar *pNVar2;
  int iVar3;
  pointer pbVar4;
  long lVar5;
  ulong uVar6;
  
  pbVar4 = (instance->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((instance->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pbVar4) {
    iVar3 = 1;
  }
  else {
    iVar3 = 1;
    lVar5 = 0;
    uVar6 = 0;
    do {
      iVar1 = std::__cxx11::string::compare((char *)((long)&(pbVar4->_M_dataplus)._M_p + lVar5));
      if (iVar1 == 0) {
        pNVar2 = child;
        if (uVar6 < ((long)(instance->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(instance->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
          pNVar2 = (parents->
                   super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar6];
        }
        iVar3 = iVar3 * (int)((ulong)((long)(pNVar2->super_Variable).values_.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pNVar2->super_Variable).values_.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5);
      }
      uVar6 = uVar6 + 1;
      pbVar4 = (instance->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x20;
    } while (uVar6 < (ulong)((long)(instance->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5))
    ;
  }
  return iVar3;
}

Assistant:

int Parser::ComputeNumOfEntries(const vector<string>& instance,
	const vector<NamedVar*>& parents, const NamedVar* child) const {
	int num_entries = 1;
	for (int i = 0; i < instance.size(); i++) {
		if (instance[i] == "-") {
			if (i < instance.size() - 1)
				num_entries *= parents[i]->Size();
			else
				num_entries *= child->Size();
		}
	}
	return num_entries;
}